

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O3

string * __thiscall
LinearRegression::generateTestDataEvaluation_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  __node_base *p_Var1;
  __node_base_ptr *pp_Var2;
  size_t *psVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong __val;
  bool bVar6;
  long lVar7;
  string *psVar8;
  char cVar9;
  long *plVar10;
  size_t sVar11;
  Attribute *pAVar12;
  undefined8 *puVar13;
  long *plVar14;
  undefined8 *puVar15;
  element_type *peVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong *puVar19;
  _func_int ***ppp_Var20;
  size_type *psVar21;
  _WordT *p_Var22;
  ulong *puVar23;
  ulong uVar24;
  char cVar25;
  LinearRegression *pLVar26;
  __node_base_ptr p_Var27;
  element_type *peVar28;
  __node_base _Var29;
  _Alloc_hider _Var30;
  _func_int **pp_Var31;
  undefined8 uVar32;
  ulong uVar33;
  string evalFunction;
  string prediction;
  string loadFunction;
  string testTuple;
  string attrConstruct;
  string attributeString;
  undefined1 local_5e0 [32];
  _WordT *local_5c0;
  long local_5b8;
  _WordT local_5b0;
  long lStack_5a8;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  element_type *local_560;
  long local_558;
  undefined1 local_550 [24];
  pointer local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  size_t *local_4e0;
  _Prime_rehash_policy local_4d8;
  __node_base_ptr p_Stack_4c8;
  __node_base *local_4c0;
  size_type local_4b8;
  __node_base local_4b0;
  size_type sStack_4a8;
  __node_base_ptr *local_4a0;
  size_t local_498;
  __node_base_ptr local_490;
  undefined8 uStack_488;
  _func_int ***local_480;
  long local_478;
  _func_int **local_470;
  long lStack_468;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  _func_int ***local_440;
  long local_438;
  _func_int **local_430;
  long lStack_428;
  _func_int ***local_420;
  long local_418;
  _func_int **local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  long lStack_3c8;
  _func_int ***local_3c0;
  long local_3b8;
  _func_int **local_3b0;
  long lStack_3a8;
  _func_int ***local_3a0;
  long local_398;
  _func_int **local_390;
  long lStack_388;
  ulong *local_380;
  long local_378;
  ulong local_370;
  long lStack_368;
  _func_int ***local_360;
  long local_358;
  _func_int **local_350;
  long lStack_348;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  _func_int ***local_320;
  long local_318;
  _func_int **local_310;
  long lStack_308;
  ulong *local_300;
  long local_2f8;
  _func_int **local_2f0;
  long lStack_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  LinearRegression *local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  _func_int ***local_1f8;
  long local_1f0;
  _func_int **local_1e8 [2];
  _func_int ***local_1d8;
  long local_1d0;
  _func_int **local_1c8 [2];
  _func_int ***local_1b8;
  long local_1b0;
  _func_int **local_1a8 [2];
  _func_int ***local_198;
  long local_190;
  _func_int **local_188 [2];
  ulong *local_178;
  long local_170;
  _func_int **local_168 [2];
  _func_int ***local_158;
  long local_150;
  _func_int **local_148 [2];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  _func_int ***local_118;
  long local_110;
  _func_int **local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  _func_int ***local_d8;
  long local_d0;
  _func_int **local_c8 [2];
  _func_int ***local_b8;
  long local_b0;
  _func_int **local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string *local_38;
  
  local_58[0] = local_48;
  local_260 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_500,'\f');
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_500);
  local_98 = &local_88;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_88 = *plVar14;
    lStack_80 = plVar10[3];
  }
  else {
    local_88 = *plVar14;
    local_98 = (long *)*plVar10;
  }
  local_90 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_38 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  uVar33 = 0;
  while( true ) {
    paVar17 = &local_500.field_2;
    sVar11 = TreeDecomposition::numberOfAttributes
                       ((local_260->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar11 <= uVar33) break;
    pAVar12 = TreeDecomposition::getAttribute
                        ((local_260->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         uVar33);
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_580,'\x0f');
    puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_580,0,(char *)0x0,0x2afdd1);
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    puVar15 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_5a0.field_2._M_allocated_capacity = *puVar15;
      local_5a0.field_2._8_8_ = puVar13[3];
    }
    else {
      local_5a0.field_2._M_allocated_capacity = *puVar15;
      local_5a0._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_5a0._M_string_length = puVar13[1];
    *puVar13 = puVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a0);
    pLVar26 = (LinearRegression *)(puVar13 + 2);
    if ((LinearRegression *)*puVar13 == pLVar26) {
      local_5e0._16_8_ = (pLVar26->super_Application)._vptr_Application;
      local_5e0._24_8_ = puVar13[3];
      local_5e0._0_8_ = (LinearRegression *)(local_5e0 + 0x10);
    }
    else {
      local_5e0._16_8_ = (pLVar26->super_Application)._vptr_Application;
      local_5e0._0_8_ = (LinearRegression *)*puVar13;
    }
    local_5e0._8_8_ = puVar13[1];
    *puVar13 = pLVar26;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    typeToStr_abi_cxx11_
              ((string *)(local_550 + 0x10),(LinearRegression *)(local_5e0 + 0x10),pAVar12->_type);
    pp_Var31 = (_func_int **)0xf;
    if ((LinearRegression *)local_5e0._0_8_ != (LinearRegression *)(local_5e0 + 0x10)) {
      pp_Var31 = (_func_int **)local_5e0._16_8_;
    }
    if (pp_Var31 < (_func_int **)((long)local_538 + local_5e0._8_8_)) {
      uVar32 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._16_8_ != &local_530) {
        uVar32 = local_530._M_allocated_capacity;
      }
      if ((ulong)uVar32 < (_func_int **)((long)local_538 + local_5e0._8_8_)) goto LAB_0014c5bb;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)(local_550 + 0x10),0,(char *)0x0,local_5e0._0_8_);
    }
    else {
LAB_0014c5bb:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_5e0,local_550._16_8_);
    }
    local_5c0 = &local_5b0;
    p_Var22 = puVar13 + 2;
    if ((_WordT *)*puVar13 == p_Var22) {
      local_5b0 = *p_Var22;
      lStack_5a8 = puVar13[3];
    }
    else {
      local_5b0 = *p_Var22;
      local_5c0 = (_WordT *)*puVar13;
    }
    local_5b8 = puVar13[1];
    *puVar13 = p_Var22;
    puVar13[1] = 0;
    *(undefined1 *)p_Var22 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_5c0);
    local_560 = (element_type *)local_550;
    peVar16 = (element_type *)(plVar10 + 2);
    if ((element_type *)*plVar10 == peVar16) {
      local_550._0_8_ =
           (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_550._8_8_ = plVar10[3];
    }
    else {
      local_550._0_8_ =
           (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_560 = (element_type *)*plVar10;
    }
    local_558 = plVar10[1];
    *plVar10 = (long)peVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_560,(ulong)(pAVar12->_name)._M_dataplus._M_p);
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar17) {
      local_520.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_520.field_2._8_8_ = plVar10[3];
    }
    else {
      local_520.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_520._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_520._M_string_length = plVar10[1];
    *plVar10 = (long)paVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar17) {
      local_500.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_500.field_2._8_8_ = plVar10[3];
    }
    else {
      local_500.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_500._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_500._M_string_length = plVar10[1];
    *plVar10 = (long)paVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_500._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
    if (local_560 != (element_type *)local_550) {
      operator_delete(local_560);
    }
    if (local_5c0 != &local_5b0) {
      operator_delete(local_5c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._16_8_ != &local_530) {
      operator_delete((void *)local_550._16_8_);
    }
    if ((LinearRegression *)local_5e0._0_8_ != (LinearRegression *)(local_5e0 + 0x10)) {
      operator_delete((void *)local_5e0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p);
    }
    local_5e0._0_8_ = local_5e0 + 0x10;
    pLVar26 = (LinearRegression *)0x6;
    std::__cxx11::string::_M_construct((ulong)local_5e0,'\x06');
    typeToStr_abi_cxx11_(&local_5a0,pLVar26,pAVar12->_type);
    pp_Var31 = (_func_int **)0xf;
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      pp_Var31 = (_func_int **)local_5e0._16_8_;
    }
    if (pp_Var31 < (_func_int **)(local_5a0._M_string_length + local_5e0._8_8_)) {
      uVar32 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        uVar32 = local_5a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar32 < (_func_int **)(local_5a0._M_string_length + local_5e0._8_8_))
      goto LAB_0014c899;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_5a0,0,(char *)0x0,local_5e0._0_8_);
    }
    else {
LAB_0014c899:
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append(local_5e0,(ulong)local_5a0._M_dataplus._M_p);
    }
    local_5c0 = &local_5b0;
    p_Var22 = puVar13 + 2;
    if ((_WordT *)*puVar13 == p_Var22) {
      local_5b0 = *p_Var22;
      lStack_5a8 = puVar13[3];
    }
    else {
      local_5b0 = *p_Var22;
      local_5c0 = (_WordT *)*puVar13;
    }
    local_5b8 = puVar13[1];
    *puVar13 = p_Var22;
    puVar13[1] = 0;
    *(undefined1 *)p_Var22 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_5c0);
    local_560 = (element_type *)local_550;
    peVar16 = (element_type *)(plVar10 + 2);
    if ((element_type *)*plVar10 == peVar16) {
      local_550._0_8_ =
           (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_550._8_8_ = plVar10[3];
    }
    else {
      local_550._0_8_ =
           (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_560 = (element_type *)*plVar10;
    }
    local_558 = plVar10[1];
    *plVar10 = (long)peVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_560,(ulong)(pAVar12->_name)._M_dataplus._M_p);
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar17) {
      local_520.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_520.field_2._8_8_ = plVar10[3];
    }
    else {
      local_520.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_520._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_520._M_string_length = plVar10[1];
    *plVar10 = (long)paVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar17) {
      local_500.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_500.field_2._8_8_ = plVar10[3];
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    }
    else {
      local_500.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_500._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_500._M_string_length = plVar10[1];
    *plVar10 = (long)paVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_58,(ulong)local_500._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
    if (local_560 != (element_type *)local_550) {
      operator_delete(local_560);
    }
    if (local_5c0 != &local_5b0) {
      operator_delete(local_5c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      operator_delete((void *)local_5e0._0_8_);
    }
    uVar33 = uVar33 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_560 = (element_type *)local_550;
  std::__cxx11::string::_M_construct((ulong)&local_560,'\x0f');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_560,0,(char *)0x0,0x2a3240);
  paVar5 = &local_520.field_2;
  puVar23 = (ulong *)(local_5e0 + 0x10);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar18) {
    local_520.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_520.field_2._8_8_ = plVar10[3];
    local_520._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_520.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_520._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_520._M_string_length = plVar10[1];
  *plVar10 = (long)paVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar18) {
    local_500.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_500.field_2._8_8_ = plVar10[3];
    local_500._M_dataplus._M_p = (pointer)paVar17;
  }
  else {
    local_500.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_500._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_500._M_string_length = plVar10[1];
  *plVar10 = (long)paVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_500._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar17) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar5) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if (local_560 != (element_type *)local_550) {
    operator_delete(local_560);
  }
  local_3c0 = &local_3b0;
  std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x03');
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_4e0 = &local_4d8._M_next_resize;
  puVar19 = (ulong *)(plVar10 + 2);
  if ((size_t *)*plVar10 == puVar19) {
    local_4d8._M_next_resize = *puVar19;
    p_Stack_4c8 = (__node_base_ptr)plVar10[3];
  }
  else {
    local_4d8._M_next_resize = *puVar19;
    local_4e0 = (size_t *)*plVar10;
  }
  local_4d8._0_8_ = plVar10[1];
  *plVar10 = (long)puVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_3e0 = &local_3d0;
  std::__cxx11::string::_M_construct((ulong)&local_3e0,'\x03');
  uVar33 = 0xf;
  if (local_4e0 != &local_4d8._M_next_resize) {
    uVar33 = local_4d8._M_next_resize;
  }
  if (uVar33 < (ulong)(local_3d8 + local_4d8._0_8_)) {
    uVar33 = 0xf;
    if (local_3e0 != &local_3d0) {
      uVar33 = local_3d0;
    }
    if (uVar33 < (ulong)(local_3d8 + local_4d8._0_8_)) goto LAB_0014cd53;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,(ulong)local_4e0);
  }
  else {
LAB_0014cd53:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_3e0);
  }
  local_420 = &local_410;
  ppp_Var20 = (_func_int ***)(puVar13 + 2);
  if ((_func_int ***)*puVar13 == ppp_Var20) {
    local_410 = *ppp_Var20;
    lStack_408 = puVar13[3];
  }
  else {
    local_410 = *ppp_Var20;
    local_420 = (_func_int ***)*puVar13;
  }
  local_418 = puVar13[1];
  *puVar13 = ppp_Var20;
  puVar13[1] = 0;
  *(undefined1 *)ppp_Var20 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_400 = &local_3f0;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_3f0 = *plVar14;
    lStack_3e8 = plVar10[3];
  }
  else {
    local_3f0 = *plVar14;
    local_400 = (long *)*plVar10;
  }
  local_3f8 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_58[0]);
  local_480 = &local_470;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_470 = *ppp_Var20;
    lStack_468 = plVar10[3];
  }
  else {
    local_470 = *ppp_Var20;
    local_480 = (_func_int ***)*plVar10;
  }
  local_478 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_3a0 = &local_390;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_480 != &local_470) {
    pp_Var31 = local_470;
  }
  if (pp_Var31 < (_func_int **)(local_398 + local_478)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_3a0 != &local_390) {
      pp_Var31 = local_390;
    }
    if (pp_Var31 < (_func_int **)(local_398 + local_478)) goto LAB_0014cf1a;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_480);
  }
  else {
LAB_0014cf1a:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_3a0);
  }
  local_460 = &local_450;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_450 = *puVar15;
    uStack_448 = puVar13[3];
  }
  else {
    local_450 = *puVar15;
    local_460 = (undefined8 *)*puVar13;
  }
  local_458 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar18) {
    local_530._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_530._8_8_ = puVar13[3];
    local_550._16_8_ = &local_530;
  }
  else {
    local_530._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_550._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar13;
  }
  local_538 = (pointer)puVar13[1];
  *puVar13 = paVar18;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  local_4a0 = &local_490;
  std::__cxx11::string::_M_construct((ulong)&local_4a0,'\x06');
  uVar32 = (__node_base_ptr)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._16_8_ != &local_530) {
    uVar32 = local_530._M_allocated_capacity;
  }
  if ((ulong)uVar32 < (__node_base_ptr)(local_498 + (long)local_538)) {
    p_Var27 = (__node_base_ptr)0xf;
    if (local_4a0 != &local_490) {
      p_Var27 = local_490;
    }
    if (p_Var27 < (__node_base_ptr)(local_498 + (long)local_538)) goto LAB_0014d06c;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,local_550._16_8_);
  }
  else {
LAB_0014d06c:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_550 + 0x10,(ulong)local_4a0);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar18) {
    local_580.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_580.field_2._8_8_ = puVar13[3];
  }
  else {
    local_580.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_580._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_580._M_string_length = puVar13[1];
  *puVar13 = paVar18;
  puVar13[1] = 0;
  paVar18->_M_local_buf[0] = '\0';
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_580);
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  psVar21 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar21) {
    local_5a0.field_2._M_allocated_capacity = *psVar21;
    local_5a0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_5a0.field_2._M_allocated_capacity = *psVar21;
    local_5a0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_5a0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar21;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_98);
  puVar19 = puVar13 + 2;
  if ((ulong *)*puVar13 == puVar19) {
    local_5e0._16_8_ = *puVar19;
    local_5e0._24_8_ = puVar13[3];
    local_5e0._0_8_ = puVar23;
  }
  else {
    local_5e0._16_8_ = *puVar19;
    local_5e0._0_8_ = (ulong *)*puVar13;
  }
  local_5e0._8_8_ = puVar13[1];
  *puVar13 = puVar19;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  local_440 = &local_430;
  std::__cxx11::string::_M_construct((ulong)&local_440,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if ((ulong *)local_5e0._0_8_ != puVar23) {
    pp_Var31 = (_func_int **)local_5e0._16_8_;
  }
  if (pp_Var31 < (_func_int **)(local_438 + local_5e0._8_8_)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_440 != &local_430) {
      pp_Var31 = local_430;
    }
    if (pp_Var31 < (_func_int **)(local_438 + local_5e0._8_8_)) goto LAB_0014d1f9;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,local_5e0._0_8_);
  }
  else {
LAB_0014d1f9:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_5e0,(ulong)local_440);
  }
  p_Var22 = puVar13 + 2;
  if ((_WordT *)*puVar13 == p_Var22) {
    local_5b0 = *p_Var22;
    lStack_5a8 = puVar13[3];
    local_5c0 = &local_5b0;
  }
  else {
    local_5b0 = *p_Var22;
    local_5c0 = (_WordT *)*puVar13;
  }
  local_5b8 = puVar13[1];
  *puVar13 = p_Var22;
  puVar13[1] = 0;
  *(undefined1 *)p_Var22 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_5c0);
  peVar16 = (element_type *)(plVar10 + 2);
  if ((element_type *)*plVar10 == peVar16) {
    local_550._0_8_ =
         (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_550._8_8_ = plVar10[3];
    local_560 = (element_type *)local_550;
  }
  else {
    local_550._0_8_ =
         (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_560 = (element_type *)*plVar10;
  }
  local_558 = plVar10[1];
  *plVar10 = (long)peVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4c0 = &local_4b0;
  std::__cxx11::string::_M_construct((ulong)&local_4c0,'\x03');
  peVar28 = (element_type *)0xf;
  if (local_560 != (element_type *)local_550) {
    peVar28 = (element_type *)local_550._0_8_;
  }
  if (peVar28 < (element_type *)(local_558 + local_4b8)) {
    _Var29._M_nxt = (_Hash_node_base *)(element_type *)0xf;
    if (local_4c0 != &local_4b0) {
      _Var29._M_nxt = local_4b0._M_nxt;
    }
    if (_Var29._M_nxt < (element_type *)(local_558 + local_4b8)) goto LAB_0014d337;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4c0,0,(char *)0x0,(ulong)local_560);
  }
  else {
LAB_0014d337:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_4c0);
  }
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar18) {
    local_520.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_520.field_2._8_8_ = puVar13[3];
    local_520._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_520.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_520._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_520._M_string_length = puVar13[1];
  *puVar13 = paVar18;
  puVar13[1] = 0;
  paVar18->_M_local_buf[0] = '\0';
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_520);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar18) {
    local_500.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_500.field_2._8_8_ = plVar10[3];
    local_500._M_dataplus._M_p = (pointer)paVar17;
  }
  else {
    local_500.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_500._M_dataplus._M_p = (pointer)*plVar10;
  }
  paVar17 = &local_580.field_2;
  local_500._M_string_length = plVar10[1];
  *plVar10 = (long)paVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar5) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_560 != (element_type *)local_550) {
    operator_delete(local_560);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if ((ulong *)local_5e0._0_8_ != puVar23) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != paVar17) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._16_8_ != &local_530) {
    operator_delete((void *)local_550._16_8_);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_4e0 != &local_4d8._M_next_resize) {
    operator_delete(local_4e0);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x03');
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_258 = &local_248;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_248 = *plVar14;
    lStack_240 = plVar10[3];
  }
  else {
    local_248 = *plVar14;
    local_258 = (long *)*plVar10;
  }
  local_250 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_380 = &local_370;
  puVar19 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar19) {
    local_370 = *puVar19;
    lStack_368 = plVar10[3];
  }
  else {
    local_370 = *puVar19;
    local_380 = (ulong *)*plVar10;
  }
  local_378 = plVar10[1];
  *plVar10 = (long)puVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x03');
  uVar33 = 0xf;
  if (local_380 != &local_370) {
    uVar33 = local_370;
  }
  if (uVar33 < (ulong)(local_70 + local_378)) {
    uVar33 = 0xf;
    if (local_78 != local_68) {
      uVar33 = local_68[0];
    }
    if (uVar33 < (ulong)(local_70 + local_378)) goto LAB_0014d70a;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_380);
  }
  else {
LAB_0014d70a:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_78);
  }
  local_2e0 = &local_2d0;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_2d0 = *puVar15;
    uStack_2c8 = puVar13[3];
  }
  else {
    local_2d0 = *puVar15;
    local_2e0 = (undefined8 *)*puVar13;
  }
  local_2d8 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_360 = &local_350;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_350 = *ppp_Var20;
    lStack_348 = plVar10[3];
  }
  else {
    local_350 = *ppp_Var20;
    local_360 = (_func_int ***)*plVar10;
  }
  local_358 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_360 != &local_350) {
    pp_Var31 = local_350;
  }
  if (pp_Var31 < (_func_int **)(local_d0 + local_358)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_d8 != local_c8) {
      pp_Var31 = local_c8[0];
    }
    if (pp_Var31 < (_func_int **)(local_d0 + local_358)) goto LAB_0014d867;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_0014d867:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_d8);
  }
  local_2c0 = &local_2b0;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_2b0 = *puVar15;
    uStack_2a8 = puVar13[3];
  }
  else {
    local_2b0 = *puVar15;
    local_2c0 = (undefined8 *)*puVar13;
  }
  local_2b8 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_340 = &local_330;
  puVar19 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar19) {
    local_330 = *puVar19;
    lStack_328 = plVar10[3];
  }
  else {
    local_330 = *puVar19;
    local_340 = (ulong *)*plVar10;
  }
  local_338 = plVar10[1];
  *plVar10 = (long)puVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x06');
  uVar33 = 0xf;
  if (local_340 != &local_330) {
    uVar33 = local_330;
  }
  if (uVar33 < (ulong)(local_f0 + local_338)) {
    uVar33 = 0xf;
    if (local_f8 != local_e8) {
      uVar33 = local_e8[0];
    }
    if (uVar33 < (ulong)(local_f0 + local_338)) goto LAB_0014d9c4;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_0014d9c4:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_f8);
  }
  local_2a0 = &local_290;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_290 = *puVar15;
    uStack_288 = puVar13[3];
  }
  else {
    local_290 = *puVar15;
    local_2a0 = (undefined8 *)*puVar13;
  }
  local_298 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  local_320 = &local_310;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_310 = *ppp_Var20;
    lStack_308 = plVar10[3];
  }
  else {
    local_310 = *ppp_Var20;
    local_320 = (_func_int ***)*plVar10;
  }
  local_318 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_320 != &local_310) {
    pp_Var31 = local_310;
  }
  if (pp_Var31 < (_func_int **)(local_110 + local_318)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_118 != local_108) {
      pp_Var31 = local_108[0];
    }
    if (pp_Var31 < (_func_int **)(local_110 + local_318)) goto LAB_0014db21;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_320);
  }
  else {
LAB_0014db21:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_118);
  }
  local_280 = &local_270;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_270 = *puVar15;
    uStack_268 = puVar13[3];
  }
  else {
    local_270 = *puVar15;
    local_280 = (undefined8 *)*puVar13;
  }
  local_278 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_300 = (ulong *)&local_2f0;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_2f0 = *ppp_Var20;
    lStack_2e8 = plVar10[3];
  }
  else {
    local_2f0 = *ppp_Var20;
    local_300 = (ulong *)*plVar10;
  }
  local_2f8 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if ((_func_int ***)local_300 != &local_2f0) {
    pp_Var31 = local_2f0;
  }
  if (pp_Var31 < (_func_int **)(local_130 + local_2f8)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_138 != local_128) {
      pp_Var31 = (_func_int **)local_128[0];
    }
    if (pp_Var31 < (_func_int **)(local_130 + local_2f8)) goto LAB_0014dc7e;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_138,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0014dc7e:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_138);
  }
  local_4c0 = &local_4b0;
  p_Var1 = (__node_base *)(plVar10 + 2);
  if ((__node_base *)*plVar10 == p_Var1) {
    local_4b0._M_nxt = p_Var1->_M_nxt;
    sStack_4a8 = plVar10[3];
  }
  else {
    local_4b0._M_nxt = p_Var1->_M_nxt;
    local_4c0 = (__node_base *)*plVar10;
  }
  local_4b8 = plVar10[1];
  *plVar10 = (long)p_Var1;
  plVar10[1] = 0;
  *(undefined1 *)&p_Var1->_M_nxt = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_440 = &local_430;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_430 = *ppp_Var20;
    lStack_428 = plVar10[3];
  }
  else {
    local_430 = *ppp_Var20;
    local_440 = (_func_int ***)*plVar10;
  }
  local_438 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_440 != &local_430) {
    pp_Var31 = local_430;
  }
  if (pp_Var31 < (_func_int **)(local_150 + local_438)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_158 != local_148) {
      pp_Var31 = local_148[0];
    }
    if (pp_Var31 < (_func_int **)(local_150 + local_438)) goto LAB_0014dde3;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_0014dde3:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_158);
  }
  local_4a0 = &local_490;
  pp_Var2 = (__node_base_ptr *)(puVar13 + 2);
  if ((__node_base_ptr *)*puVar13 == pp_Var2) {
    local_490 = *pp_Var2;
    uStack_488 = puVar13[3];
  }
  else {
    local_490 = *pp_Var2;
    local_4a0 = (__node_base_ptr *)*puVar13;
  }
  local_498 = puVar13[1];
  *puVar13 = pp_Var2;
  puVar13[1] = 0;
  *(undefined1 *)pp_Var2 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_3a0 = &local_390;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_390 = *ppp_Var20;
    lStack_388 = plVar10[3];
  }
  else {
    local_390 = *ppp_Var20;
    local_3a0 = (_func_int ***)*plVar10;
  }
  local_398 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_178 = (ulong *)local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_3a0 != &local_390) {
    pp_Var31 = local_390;
  }
  if (pp_Var31 < (_func_int **)(local_170 + local_398)) {
    pp_Var31 = (_func_int **)0xf;
    if ((_func_int ***)local_178 != local_168) {
      pp_Var31 = local_168[0];
    }
    if (pp_Var31 < (_func_int **)(local_170 + local_398)) goto LAB_0014df48;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_3a0);
  }
  else {
LAB_0014df48:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_178);
  }
  local_3e0 = &local_3d0;
  puVar19 = puVar13 + 2;
  if ((ulong *)*puVar13 == puVar19) {
    local_3d0 = *puVar19;
    lStack_3c8 = puVar13[3];
  }
  else {
    local_3d0 = *puVar19;
    local_3e0 = (ulong *)*puVar13;
  }
  local_3d8 = puVar13[1];
  *puVar13 = puVar19;
  puVar13[1] = 0;
  *(undefined1 *)puVar19 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_3c0 = &local_3b0;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_3b0 = *ppp_Var20;
    lStack_3a8 = plVar10[3];
  }
  else {
    local_3b0 = *ppp_Var20;
    local_3c0 = (_func_int ***)*plVar10;
  }
  local_3b8 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_3c0 != &local_3b0) {
    pp_Var31 = local_3b0;
  }
  if (pp_Var31 < (_func_int **)(local_190 + local_3b8)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_198 != local_188) {
      pp_Var31 = local_188[0];
    }
    if (pp_Var31 < (_func_int **)(local_190 + local_3b8)) goto LAB_0014e0ad;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_3c0);
  }
  else {
LAB_0014e0ad:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_198);
  }
  local_4e0 = &local_4d8._M_next_resize;
  psVar3 = puVar13 + 2;
  if ((size_t *)*puVar13 == psVar3) {
    local_4d8._M_next_resize = *psVar3;
    p_Stack_4c8 = (__node_base_ptr)puVar13[3];
  }
  else {
    local_4d8._M_next_resize = *psVar3;
    local_4e0 = (size_t *)*puVar13;
  }
  local_4d8._0_8_ = puVar13[1];
  *puVar13 = psVar3;
  puVar13[1] = 0;
  *(undefined1 *)psVar3 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_420 = &local_410;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_410 = *ppp_Var20;
    lStack_408 = plVar10[3];
  }
  else {
    local_410 = *ppp_Var20;
    local_420 = (_func_int ***)*plVar10;
  }
  local_418 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_420 != &local_410) {
    pp_Var31 = local_410;
  }
  if (pp_Var31 < (_func_int **)(local_1b0 + local_418)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1b8 != local_1a8) {
      pp_Var31 = local_1a8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1b0 + local_418)) goto LAB_0014e212;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_420);
  }
  else {
LAB_0014e212:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_1b8);
  }
  local_400 = &local_3f0;
  plVar10 = puVar13 + 2;
  if ((long *)*puVar13 == plVar10) {
    local_3f0 = *plVar10;
    lStack_3e8 = puVar13[3];
  }
  else {
    local_3f0 = *plVar10;
    local_400 = (long *)*puVar13;
  }
  local_3f8 = puVar13[1];
  *puVar13 = plVar10;
  puVar13[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_480 = &local_470;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_470 = *ppp_Var20;
    lStack_468 = plVar10[3];
  }
  else {
    local_470 = *ppp_Var20;
    local_480 = (_func_int ***)*plVar10;
  }
  local_478 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_480 != &local_470) {
    pp_Var31 = local_470;
  }
  if (pp_Var31 < (_func_int **)(local_1d0 + local_478)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1d8 != local_1c8) {
      pp_Var31 = local_1c8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1d0 + local_478)) goto LAB_0014e377;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_480);
  }
  else {
LAB_0014e377:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_1d8);
  }
  local_460 = &local_450;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_450 = *puVar15;
    uStack_448 = puVar13[3];
  }
  else {
    local_450 = *puVar15;
    local_460 = (undefined8 *)*puVar13;
  }
  local_458 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar18) {
    local_530._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_530._8_8_ = puVar13[3];
    local_550._16_8_ = &local_530;
  }
  else {
    local_530._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_550._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar13;
  }
  local_538 = (pointer)puVar13[1];
  *puVar13 = paVar18;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\t');
  uVar32 = (_func_int **)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._16_8_ != &local_530) {
    uVar32 = local_530._M_allocated_capacity;
  }
  if ((ulong)uVar32 < (_func_int **)(local_1f0 + (long)local_538)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1f8 != local_1e8) {
      pp_Var31 = local_1e8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1f0 + (long)local_538)) goto LAB_0014e4cd;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,local_550._16_8_);
  }
  else {
LAB_0014e4cd:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_550 + 0x10,(ulong)local_1f8);
  }
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar18) {
    local_580.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_580.field_2._8_8_ = puVar13[3];
    local_580._M_dataplus._M_p = (pointer)paVar17;
  }
  else {
    local_580.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_580._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_580._M_string_length = puVar13[1];
  *puVar13 = paVar18;
  puVar13[1] = 0;
  paVar18->_M_local_buf[0] = '\0';
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_580);
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  puVar19 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_5a0.field_2._M_allocated_capacity = *puVar19;
    local_5a0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_5a0.field_2._M_allocated_capacity = *puVar19;
    local_5a0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_5a0._M_string_length = plVar10[1];
  *plVar10 = (long)puVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
  uVar32 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    uVar32 = local_5a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar32 < local_5a0._M_string_length + local_210) {
    uVar33 = 0xf;
    if (local_218 != local_208) {
      uVar33 = local_208[0];
    }
    if (uVar33 < local_5a0._M_string_length + local_210) goto LAB_0014e602;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_218,0,(char *)0x0,(ulong)local_5a0._M_dataplus._M_p);
  }
  else {
LAB_0014e602:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_218);
  }
  puVar19 = puVar13 + 2;
  if ((ulong *)*puVar13 == puVar19) {
    local_5e0._16_8_ = *puVar19;
    local_5e0._24_8_ = puVar13[3];
    local_5e0._0_8_ = puVar23;
  }
  else {
    local_5e0._16_8_ = *puVar19;
    local_5e0._0_8_ = (ulong *)*puVar13;
  }
  local_5e0._8_8_ = puVar13[1];
  *puVar13 = puVar19;
  puVar13[1] = 0;
  *(undefined1 *)puVar19 = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_5e0);
  p_Var22 = puVar13 + 2;
  if ((_WordT *)*puVar13 == p_Var22) {
    local_5b0 = *p_Var22;
    lStack_5a8 = puVar13[3];
    local_5c0 = &local_5b0;
  }
  else {
    local_5b0 = *p_Var22;
    local_5c0 = (_WordT *)*puVar13;
  }
  local_5b8 = puVar13[1];
  *puVar13 = p_Var22;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x03');
  uVar33 = 0xf;
  if (local_5c0 != &local_5b0) {
    uVar33 = local_5b0;
  }
  if (uVar33 < (ulong)(local_230 + local_5b8)) {
    uVar33 = 0xf;
    if (local_238 != local_228) {
      uVar33 = local_228[0];
    }
    if (uVar33 < (ulong)(local_230 + local_5b8)) goto LAB_0014e72a;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_238,0,(char *)0x0,(ulong)local_5c0);
  }
  else {
LAB_0014e72a:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_238);
  }
  peVar16 = (element_type *)(plVar10 + 2);
  if ((element_type *)*plVar10 == peVar16) {
    local_550._0_8_ =
         (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_550._8_8_ = plVar10[3];
    local_560 = (element_type *)local_550;
  }
  else {
    local_550._0_8_ =
         (peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_560 = (element_type *)*plVar10;
  }
  local_558 = plVar10[1];
  *plVar10 = (long)peVar16;
  plVar10[1] = 0;
  *(undefined1 *)
   &(peVar16->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_560);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar18) {
    local_520.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_520.field_2._8_8_ = plVar10[3];
    local_520._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_520.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_520._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_520._M_string_length = plVar10[1];
  *plVar10 = (long)paVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_560 != (element_type *)local_550) {
    operator_delete(local_560);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0);
  }
  if ((ulong *)local_5e0._0_8_ != puVar23) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != paVar17) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._16_8_ != &local_530) {
    operator_delete((void *)local_550._16_8_);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_4e0 != &local_4d8._M_next_resize) {
    operator_delete(local_4e0);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if ((_func_int ***)local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if ((_func_int ***)local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  local_560 = (element_type *)local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"");
  uVar33 = 0;
  pLVar26 = local_260;
  do {
    if (((pLVar26->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar33 >> 6] >>
         (uVar33 & 0x3f) & 1) != 0) {
      pAVar12 = TreeDecomposition::getAttribute
                          ((pLVar26->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           uVar33);
      if (((pLVar26->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar33 >> 6] &
          1L << ((byte)uVar33 & 0x3f)) == 0) {
        __val = (pLVar26->_parameterIndex).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar33];
        cVar25 = '\x01';
        if (9 < __val) {
          uVar24 = __val;
          cVar9 = '\x04';
          do {
            cVar25 = cVar9;
            if (uVar24 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0014ee5d;
            }
            if (uVar24 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0014ee5d;
            }
            if (uVar24 < 10000) goto LAB_0014ee5d;
            bVar6 = 99999 < uVar24;
            uVar24 = uVar24 / 10000;
            cVar9 = cVar25 + '\x04';
          } while (bVar6);
          cVar25 = cVar25 + '\x01';
        }
LAB_0014ee5d:
        local_550._16_8_ = &local_530;
        std::__cxx11::string::_M_construct((ulong)(local_550 + 0x10),cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_550._16_8_,(uint)local_538,__val);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)(local_550 + 0x10),0,(char *)0x0,0x2a26af);
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar17) {
          local_580.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_580.field_2._8_8_ = puVar13[3];
        }
        else {
          local_580.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_580._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_580._M_string_length = puVar13[1];
        *puVar13 = paVar17;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_580);
        local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
        puVar23 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_5a0.field_2._M_allocated_capacity = *puVar23;
          local_5a0.field_2._8_8_ = puVar13[3];
        }
        else {
          local_5a0.field_2._M_allocated_capacity = *puVar23;
          local_5a0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_5a0._M_string_length = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_5a0,(ulong)(pAVar12->_name)._M_dataplus._M_p);
        puVar23 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar23) {
          local_5e0._16_8_ = *puVar23;
          local_5e0._24_8_ = puVar13[3];
          local_5e0._0_8_ = local_5e0 + 0x10;
        }
        else {
          local_5e0._16_8_ = *puVar23;
          local_5e0._0_8_ = (ulong *)*puVar13;
        }
        local_5e0._8_8_ = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(local_5e0);
        p_Var22 = puVar13 + 2;
        if ((_WordT *)*puVar13 == p_Var22) {
          local_5b0 = *p_Var22;
          lStack_5a8 = puVar13[3];
          local_5c0 = &local_5b0;
        }
        else {
          local_5b0 = *p_Var22;
          local_5c0 = (_WordT *)*puVar13;
        }
        local_5b8 = puVar13[1];
        *puVar13 = p_Var22;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_5c0);
        if (local_5c0 != &local_5b0) {
          operator_delete(local_5c0);
        }
        if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
          operator_delete((void *)local_5e0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p);
        }
        pLVar26 = local_260;
        _Var30._M_p = (pointer)local_550._16_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._16_8_ != &local_530) goto LAB_0014ee37;
      }
      else {
        std::operator+(&local_580,"params[index_",&pAVar12->_name);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_580);
        local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
        puVar23 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_5a0.field_2._M_allocated_capacity = *puVar23;
          local_5a0.field_2._8_8_ = puVar13[3];
        }
        else {
          local_5a0.field_2._M_allocated_capacity = *puVar23;
          local_5a0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_5a0._M_string_length = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_5a0,(ulong)(pAVar12->_name)._M_dataplus._M_p);
        puVar23 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar23) {
          local_5e0._16_8_ = *puVar23;
          local_5e0._24_8_ = puVar13[3];
          local_5e0._0_8_ = local_5e0 + 0x10;
        }
        else {
          local_5e0._16_8_ = *puVar23;
          local_5e0._0_8_ = (ulong *)*puVar13;
        }
        local_5e0._8_8_ = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append(local_5e0);
        p_Var22 = puVar13 + 2;
        if ((_WordT *)*puVar13 == p_Var22) {
          local_5b0 = *p_Var22;
          lStack_5a8 = puVar13[3];
          local_5c0 = &local_5b0;
        }
        else {
          local_5b0 = *p_Var22;
          local_5c0 = (_WordT *)*puVar13;
        }
        local_5b8 = puVar13[1];
        *puVar13 = p_Var22;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_5c0);
        if (local_5c0 != &local_5b0) {
          operator_delete(local_5c0);
        }
        if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
          operator_delete((void *)local_5e0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p);
        }
        pLVar26 = local_260;
        _Var30._M_p = local_580._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
LAB_0014ee37:
          operator_delete(_Var30._M_p);
          pLVar26 = local_260;
        }
      }
    }
    uVar33 = uVar33 + 1;
  } while (uVar33 != 100);
  std::__cxx11::string::pop_back();
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x03');
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_78);
  pcVar4 = local_5e0 + 0x10;
  local_b8 = &local_a8;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_a8 = *ppp_Var20;
    lStack_a0 = plVar10[3];
  }
  else {
    local_a8 = *ppp_Var20;
    local_b8 = (_func_int ***)*plVar10;
  }
  local_b0 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x03');
  pp_Var31 = (_func_int **)0xf;
  if (local_b8 != &local_a8) {
    pp_Var31 = local_a8;
  }
  if (pp_Var31 < (_func_int **)(local_d0 + local_b0)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_d8 != local_c8) {
      pp_Var31 = local_c8[0];
    }
    if (pp_Var31 < (_func_int **)(local_d0 + local_b0)) goto LAB_0014f1b8;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_0014f1b8:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
  }
  local_258 = &local_248;
  plVar10 = puVar13 + 2;
  if ((long *)*puVar13 == plVar10) {
    local_248 = *plVar10;
    lStack_240 = puVar13[3];
  }
  else {
    local_248 = *plVar10;
    local_258 = (long *)*puVar13;
  }
  local_250 = puVar13[1];
  *puVar13 = plVar10;
  puVar13[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_380 = &local_370;
  puVar23 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar23) {
    local_370 = *puVar23;
    lStack_368 = plVar10[3];
  }
  else {
    local_370 = *puVar23;
    local_380 = (ulong *)*plVar10;
  }
  local_378 = plVar10[1];
  *plVar10 = (long)puVar23;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x06');
  uVar33 = 0xf;
  if (local_380 != &local_370) {
    uVar33 = local_370;
  }
  if (uVar33 < (ulong)(local_f0 + local_378)) {
    uVar33 = 0xf;
    if (local_f8 != local_e8) {
      uVar33 = local_e8[0];
    }
    if (uVar33 < (ulong)(local_f0 + local_378)) goto LAB_0014f31c;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_380);
  }
  else {
LAB_0014f31c:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_f8);
  }
  local_2e0 = &local_2d0;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_2d0 = *puVar15;
    uStack_2c8 = puVar13[3];
  }
  else {
    local_2d0 = *puVar15;
    local_2e0 = (undefined8 *)*puVar13;
  }
  local_2d8 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_360 = &local_350;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_350 = *ppp_Var20;
    lStack_348 = plVar10[3];
  }
  else {
    local_350 = *ppp_Var20;
    local_360 = (_func_int ***)*plVar10;
  }
  local_358 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_360 != &local_350) {
    pp_Var31 = local_350;
  }
  if (pp_Var31 < (_func_int **)(local_110 + local_358)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_118 != local_108) {
      pp_Var31 = local_108[0];
    }
    if (pp_Var31 < (_func_int **)(local_110 + local_358)) goto LAB_0014f480;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_0014f480:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_118);
  }
  local_2c0 = &local_2b0;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_2b0 = *puVar15;
    uStack_2a8 = puVar13[3];
  }
  else {
    local_2b0 = *puVar15;
    local_2c0 = (undefined8 *)*puVar13;
  }
  local_2b8 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_340 = &local_330;
  puVar23 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar23) {
    local_330 = *puVar23;
    lStack_328 = plVar10[3];
  }
  else {
    local_330 = *puVar23;
    local_340 = (ulong *)*plVar10;
  }
  local_338 = plVar10[1];
  *plVar10 = (long)puVar23;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_340 != &local_330) {
    pp_Var31 = (_func_int **)local_330;
  }
  if (pp_Var31 < (_func_int **)(local_130 + local_338)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_138 != local_128) {
      pp_Var31 = (_func_int **)local_128[0];
    }
    if (pp_Var31 < (_func_int **)(local_130 + local_338)) goto LAB_0014f5e4;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_0014f5e4:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_138);
  }
  local_2a0 = &local_290;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_290 = *puVar15;
    uStack_288 = puVar13[3];
  }
  else {
    local_290 = *puVar15;
    local_2a0 = (undefined8 *)*puVar13;
  }
  local_298 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  local_320 = &local_310;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_310 = *ppp_Var20;
    lStack_308 = plVar10[3];
  }
  else {
    local_310 = *ppp_Var20;
    local_320 = (_func_int ***)*plVar10;
  }
  local_318 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_320 != &local_310) {
    pp_Var31 = local_310;
  }
  if (pp_Var31 < (_func_int **)(local_150 + local_318)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_158 != local_148) {
      pp_Var31 = local_148[0];
    }
    if (pp_Var31 < (_func_int **)(local_150 + local_318)) goto LAB_0014f748;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_320);
  }
  else {
LAB_0014f748:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_158);
  }
  local_280 = &local_270;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_270 = *puVar15;
    uStack_268 = puVar13[3];
  }
  else {
    local_270 = *puVar15;
    local_280 = (undefined8 *)*puVar13;
  }
  local_278 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_300 = (ulong *)&local_2f0;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_2f0 = *ppp_Var20;
    lStack_2e8 = plVar10[3];
  }
  else {
    local_2f0 = *ppp_Var20;
    local_300 = (ulong *)*plVar10;
  }
  local_2f8 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_178 = (ulong *)local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if ((_func_int ***)local_300 != &local_2f0) {
    pp_Var31 = local_2f0;
  }
  if (pp_Var31 < (_func_int **)(local_170 + local_2f8)) {
    pp_Var31 = (_func_int **)0xf;
    if ((_func_int ***)local_178 != local_168) {
      pp_Var31 = local_168[0];
    }
    if (pp_Var31 < (_func_int **)(local_170 + local_2f8)) goto LAB_0014f8ac;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_178,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0014f8ac:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_178);
  }
  local_4c0 = &local_4b0;
  p_Var1 = (__node_base *)(plVar10 + 2);
  if ((__node_base *)*plVar10 == p_Var1) {
    local_4b0._M_nxt = p_Var1->_M_nxt;
    sStack_4a8 = plVar10[3];
  }
  else {
    local_4b0._M_nxt = p_Var1->_M_nxt;
    local_4c0 = (__node_base *)*plVar10;
  }
  local_4b8 = plVar10[1];
  *plVar10 = (long)p_Var1;
  plVar10[1] = 0;
  *(undefined1 *)&p_Var1->_M_nxt = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_440 = &local_430;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_430 = *ppp_Var20;
    lStack_428 = plVar10[3];
  }
  else {
    local_430 = *ppp_Var20;
    local_440 = (_func_int ***)*plVar10;
  }
  local_438 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_440 != &local_430) {
    pp_Var31 = local_430;
  }
  if (pp_Var31 < (_func_int **)(local_190 + local_438)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_198 != local_188) {
      pp_Var31 = local_188[0];
    }
    if (pp_Var31 < (_func_int **)(local_190 + local_438)) goto LAB_0014fa10;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_0014fa10:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_198);
  }
  local_4a0 = &local_490;
  pp_Var2 = (__node_base_ptr *)(puVar13 + 2);
  if ((__node_base_ptr *)*puVar13 == pp_Var2) {
    local_490 = *pp_Var2;
    uStack_488 = puVar13[3];
  }
  else {
    local_490 = *pp_Var2;
    local_4a0 = (__node_base_ptr *)*puVar13;
  }
  local_498 = puVar13[1];
  *puVar13 = pp_Var2;
  puVar13[1] = 0;
  *(undefined1 *)pp_Var2 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_3a0 = &local_390;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_390 = *ppp_Var20;
    lStack_388 = plVar10[3];
  }
  else {
    local_390 = *ppp_Var20;
    local_3a0 = (_func_int ***)*plVar10;
  }
  local_398 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_560);
  local_3e0 = &local_3d0;
  puVar23 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar23) {
    local_3d0 = *puVar23;
    lStack_3c8 = plVar10[3];
  }
  else {
    local_3d0 = *puVar23;
    local_3e0 = (ulong *)*plVar10;
  }
  local_3d8 = plVar10[1];
  *plVar10 = (long)puVar23;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_3c0 = &local_3b0;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_3b0 = *ppp_Var20;
    lStack_3a8 = plVar10[3];
  }
  else {
    local_3b0 = *ppp_Var20;
    local_3c0 = (_func_int ***)*plVar10;
  }
  local_3b8 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_3c0 != &local_3b0) {
    pp_Var31 = local_3b0;
  }
  if (pp_Var31 < (_func_int **)(local_1b0 + local_3b8)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1b8 != local_1a8) {
      pp_Var31 = local_1a8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1b0 + local_3b8)) goto LAB_0014fc47;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_3c0);
  }
  else {
LAB_0014fc47:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_1b8);
  }
  local_4e0 = &local_4d8._M_next_resize;
  psVar3 = puVar13 + 2;
  if ((size_t *)*puVar13 == psVar3) {
    local_4d8._M_next_resize = *psVar3;
    p_Stack_4c8 = (__node_base_ptr)puVar13[3];
  }
  else {
    local_4d8._M_next_resize = *psVar3;
    local_4e0 = (size_t *)*puVar13;
  }
  local_4d8._0_8_ = puVar13[1];
  *puVar13 = psVar3;
  puVar13[1] = 0;
  *(undefined1 *)psVar3 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_420 = &local_410;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_410 = *ppp_Var20;
    lStack_408 = plVar10[3];
  }
  else {
    local_410 = *ppp_Var20;
    local_420 = (_func_int ***)*plVar10;
  }
  local_418 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_420 != &local_410) {
    pp_Var31 = local_410;
  }
  if (pp_Var31 < (_func_int **)(local_1d0 + local_418)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1d8 != local_1c8) {
      pp_Var31 = local_1c8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1d0 + local_418)) goto LAB_0014fdab;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_420);
  }
  else {
LAB_0014fdab:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_1d8);
  }
  local_400 = &local_3f0;
  plVar10 = puVar13 + 2;
  if ((long *)*puVar13 == plVar10) {
    local_3f0 = *plVar10;
    lStack_3e8 = puVar13[3];
  }
  else {
    local_3f0 = *plVar10;
    local_400 = (long *)*puVar13;
  }
  local_3f8 = puVar13[1];
  *puVar13 = plVar10;
  puVar13[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_480 = &local_470;
  ppp_Var20 = (_func_int ***)(plVar10 + 2);
  if ((_func_int ***)*plVar10 == ppp_Var20) {
    local_470 = *ppp_Var20;
    lStack_468 = plVar10[3];
  }
  else {
    local_470 = *ppp_Var20;
    local_480 = (_func_int ***)*plVar10;
  }
  local_478 = plVar10[1];
  *plVar10 = (long)ppp_Var20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_480 != &local_470) {
    pp_Var31 = local_470;
  }
  if (pp_Var31 < (_func_int **)(local_1f0 + local_478)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1f8 != local_1e8) {
      pp_Var31 = local_1e8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1f0 + local_478)) goto LAB_0014ff0f;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_480);
  }
  else {
LAB_0014ff0f:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_1f8);
  }
  local_460 = &local_450;
  puVar15 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar15) {
    local_450 = *puVar15;
    uStack_448 = puVar13[3];
  }
  else {
    local_450 = *puVar15;
    local_460 = (undefined8 *)*puVar13;
  }
  local_458 = puVar13[1];
  *puVar13 = puVar15;
  puVar13[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar17) {
    local_530._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_530._8_8_ = plVar10[3];
    local_550._16_8_ = &local_530;
  }
  else {
    local_530._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_550._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar10;
  }
  local_538 = (pointer)plVar10[1];
  *plVar10 = (long)paVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
  uVar32 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._16_8_ != &local_530) {
    uVar32 = local_530._M_allocated_capacity;
  }
  if ((ulong)uVar32 < (ulong)(local_210 + (long)local_538)) {
    uVar33 = 0xf;
    if (local_218 != local_208) {
      uVar33 = local_208[0];
    }
    if (uVar33 < (ulong)(local_210 + (long)local_538)) goto LAB_00150064;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,local_550._16_8_);
  }
  else {
LAB_00150064:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_550 + 0x10,(ulong)local_218);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  psVar21 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar21) {
    local_580.field_2._M_allocated_capacity = *psVar21;
    local_580.field_2._8_8_ = puVar13[3];
  }
  else {
    local_580.field_2._M_allocated_capacity = *psVar21;
    local_580._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_580._M_string_length = puVar13[1];
  *puVar13 = psVar21;
  puVar13[1] = 0;
  *(undefined1 *)psVar21 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_580);
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  puVar23 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_5a0.field_2._M_allocated_capacity = *puVar23;
    local_5a0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_5a0.field_2._M_allocated_capacity = *puVar23;
    local_5a0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_5a0._M_string_length = plVar10[1];
  *plVar10 = (long)puVar23;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x03');
  uVar32 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    uVar32 = local_5a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar32 < local_5a0._M_string_length + local_230) {
    uVar33 = 0xf;
    if (local_238 != local_228) {
      uVar33 = local_228[0];
    }
    if (local_5a0._M_string_length + local_230 <= uVar33) {
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_238,0,(char *)0x0,(ulong)local_5a0._M_dataplus._M_p);
      goto LAB_001501b8;
    }
  }
  puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_238);
LAB_001501b8:
  psVar21 = puVar13 + 2;
  if ((size_type *)*puVar13 == psVar21) {
    local_5e0._16_8_ = *psVar21;
    local_5e0._24_8_ = puVar13[3];
    local_5e0._0_8_ = pcVar4;
  }
  else {
    local_5e0._16_8_ = *psVar21;
    local_5e0._0_8_ = (size_type *)*puVar13;
  }
  local_5e0._8_8_ = puVar13[1];
  *puVar13 = psVar21;
  puVar13[1] = 0;
  *(char *)psVar21 = '\0';
  plVar10 = (long *)std::__cxx11::string::append(local_5e0);
  p_Var22 = (_WordT *)(plVar10 + 2);
  if ((_WordT *)*plVar10 == p_Var22) {
    local_5b0 = *p_Var22;
    lStack_5a8 = plVar10[3];
    local_5c0 = &local_5b0;
  }
  else {
    local_5b0 = *p_Var22;
    local_5c0 = (_WordT *)*plVar10;
  }
  local_5b8 = plVar10[1];
  *plVar10 = (long)p_Var22;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((pointer)local_5e0._0_8_ != pcVar4) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._16_8_ != &local_530) {
    operator_delete((void *)local_550._16_8_);
  }
  psVar8 = local_38;
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_4e0 != &local_4d8._M_next_resize) {
    operator_delete(local_4e0);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if ((_func_int ***)local_178 != local_168) {
    operator_delete(local_178);
  }
  if ((_func_int ***)local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0,
                 &local_500,&local_520);
  plVar10 = (long *)std::__cxx11::string::_M_append(local_5e0,(ulong)local_5c0);
  (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
  psVar21 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar21) {
    lVar7 = plVar10[3];
    (psVar8->field_2)._M_allocated_capacity = *psVar21;
    *(long *)((long)&psVar8->field_2 + 8) = lVar7;
  }
  else {
    (psVar8->_M_dataplus)._M_p = (pointer)*plVar10;
    (psVar8->field_2)._M_allocated_capacity = *psVar21;
  }
  psVar8->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar21;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((pointer)local_5e0._0_8_ != pcVar4) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0);
  }
  if (local_560 != (element_type *)local_550) {
    operator_delete(local_560);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return psVar8;
}

Assistant:

std::string LinearRegression::generateTestDataEvaluation()
{
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"test_data.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";
    
    std::string prediction = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        
        if (_categoricalFeatures[var])
            prediction += "params[index_"+att->_name+"[tuple."+att->_name+"]]+";
        else
            prediction += "params["+std::to_string(_parameterIndex[var])+
                "]*tuple."+att->_name+"+";
    }
    prediction.pop_back();
    
    std::string evalFunction = offset(1)+"void evaluateModel()\n"+offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"double diff, error = 0.0;\n"+
        offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"diff = params[0]+"+prediction+";\n"+
        offset(3)+"error += diff * diff;\n"+
        offset(2)+"}\n"+
        offset(2)+"error /= TestDataset.size();\n"+
        offset(2)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}